

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O2

void __thiscall leveldb::Benchmark::ReadSequential(Benchmark *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i;
  sqlite3_stmt *pStmt;
  string read_str;
  
  std::__cxx11::string::string
            ((string *)&read_str,"SELECT * FROM test ORDER BY key",(allocator *)&pStmt);
  iVar1 = sqlite3_prepare_v2(this->db_,read_str._M_dataplus._M_p,0xffffffffffffffff,&pStmt,0);
  ErrorCheck(iVar1);
  for (iVar1 = 0; iVar1 < this->reads_; iVar1 = iVar1 + 1) {
    iVar2 = sqlite3_step(pStmt);
    if (iVar2 != 100) break;
    iVar2 = sqlite3_column_bytes(pStmt,1);
    iVar3 = sqlite3_column_bytes(pStmt,2);
    this->bytes_ = this->bytes_ + (long)(iVar3 + iVar2);
    FinishedSingleOp(this);
  }
  iVar1 = sqlite3_finalize(pStmt);
  ErrorCheck(iVar1);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void ReadSequential() {
    int status;
    sqlite3_stmt* pStmt;
    std::string read_str = "SELECT * FROM test ORDER BY key";

    status = sqlite3_prepare_v2(db_, read_str.c_str(), -1, &pStmt, nullptr);
    ErrorCheck(status);
    for (int i = 0; i < reads_ && SQLITE_ROW == sqlite3_step(pStmt); i++) {
      bytes_ += sqlite3_column_bytes(pStmt, 1) + sqlite3_column_bytes(pStmt, 2);
      FinishedSingleOp();
    }

    status = sqlite3_finalize(pStmt);
    ErrorCheck(status);
  }